

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_encode(opj_j2k_t *j2k,opj_cio_t *cio,opj_image_t *image,
                   opj_codestream_info_t *cstr_info)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  OPJ_UINT32 OVar10;
  opj_cp_t *cp;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  opj_codestream_info_t *cstr_info_00;
  opj_image_t *poVar13;
  opj_cp_t *poVar14;
  char *__s;
  opj_tp_info_t *poVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  opj_tile_info_t *poVar23;
  int *piVar24;
  opj_marker_info_t *poVar25;
  size_t sVar26;
  opj_tcd_t *tcd;
  ulong uVar27;
  uint compno;
  ulong uVar28;
  int iVar29;
  unsigned_long_long v;
  int iVar30;
  opj_cio_t *poVar31;
  long lVar32;
  
  j2k->cio = cio;
  j2k->image = image;
  cp = j2k->cp;
  j2k->cstr_info = cstr_info;
  poVar31 = cio;
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar17 = cp->tw;
    iVar18 = cp->th;
    poVar23 = (opj_tile_info_t *)malloc((long)(iVar18 * iVar17) * 0x260);
    cstr_info->tile = poVar23;
    uVar2 = image->x1;
    uVar4 = image->y1;
    uVar3 = image->x0;
    uVar5 = image->y0;
    cstr_info->image_w = uVar2 - uVar3;
    cstr_info->image_h = uVar4 - uVar5;
    poVar11 = cp->tcps;
    cstr_info->prog = poVar11->prg;
    cstr_info->tw = iVar17;
    cstr_info->th = iVar18;
    uVar6 = cp->tx0;
    uVar7 = cp->ty0;
    uVar8 = cp->tdx;
    uVar9 = cp->tdy;
    cstr_info->tile_x = uVar8;
    cstr_info->tile_y = uVar9;
    cstr_info->tile_Ox = uVar6;
    cstr_info->tile_Oy = uVar7;
    uVar28 = (ulong)image->numcomps;
    cstr_info->numcomps = image->numcomps;
    cstr_info->numlayers = poVar11->numlayers;
    piVar24 = (int *)malloc(uVar28 * 4);
    cstr_info->numdecompos = piVar24;
    if (uVar28 != 0) {
      poVar12 = poVar11->tccps;
      uVar27 = 0;
      do {
        piVar24[uVar27] = poVar12->numresolutions - 1;
        uVar27 = uVar27 + 1;
      } while (uVar28 != uVar27);
    }
    cstr_info->D_max = 0.0;
    iVar17 = cio_tell(cio);
    cstr_info->main_head_start = iVar17;
    cstr_info->maxmarknum = 100;
    poVar25 = (opj_marker_info_t *)malloc(0x960);
    cstr_info->marker = poVar25;
    cstr_info->marknum = 0;
    poVar31 = j2k->cio;
  }
  cio_write(poVar31,0xff4f,2);
  cstr_info_00 = j2k->cstr_info;
  if (cstr_info_00 != (opj_codestream_info_t *)0x0) {
    iVar17 = cio_tell(poVar31);
    j2k_add_mhmarker(cstr_info_00,0xff4f,iVar17,0);
  }
  poVar31 = j2k->cio;
  poVar13 = j2k->image;
  poVar14 = j2k->cp;
  cio_write(poVar31,0xff51,2);
  iVar17 = cio_tell(poVar31);
  cio_skip(poVar31,2);
  cio_write(poVar31,(ulong)poVar14->rsiz,2);
  cio_write(poVar31,(ulong)poVar13->x1,4);
  cio_write(poVar31,(ulong)poVar13->y1,4);
  cio_write(poVar31,(ulong)poVar13->x0,4);
  cio_write(poVar31,(ulong)poVar13->y0,4);
  cio_write(poVar31,(long)poVar14->tdx,4);
  cio_write(poVar31,(long)poVar14->tdy,4);
  cio_write(poVar31,(long)poVar14->tx0,4);
  cio_write(poVar31,(long)poVar14->ty0,4);
  cio_write(poVar31,(ulong)poVar13->numcomps,2);
  if (poVar13->numcomps != 0) {
    lVar32 = 0;
    uVar28 = 0;
    do {
      cio_write(poVar31,(ulong)((*(int *)((long)&poVar13->comps->prec + lVar32) +
                                *(int *)((long)&poVar13->comps->sgnd + lVar32) * 0x80) - 1),1);
      cio_write(poVar31,(ulong)*(uint *)((long)&poVar13->comps->dx + lVar32),1);
      cio_write(poVar31,(ulong)*(uint *)((long)&poVar13->comps->dy + lVar32),1);
      uVar28 = uVar28 + 1;
      lVar32 = lVar32 + 0x38;
    } while (uVar28 < poVar13->numcomps);
  }
  iVar18 = cio_tell(poVar31);
  cio_seek(poVar31,iVar17);
  cio_write(poVar31,(long)(iVar18 - iVar17),2);
  cio_seek(poVar31,iVar18);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    j2k_add_mhmarker(j2k->cstr_info,0xff51,iVar17,iVar18 - iVar17);
  }
  poVar31 = j2k->cio;
  cio_write(poVar31,0xff52,2);
  iVar18 = cio_tell(poVar31);
  cio_skip(poVar31,2);
  poVar11 = j2k->cp->tcps;
  iVar17 = j2k->curtileno;
  cio_write(poVar31,(long)poVar11[iVar17].csty,1);
  cio_write(poVar31,(long)poVar11[iVar17].prg,1);
  cio_write(poVar31,(long)poVar11[iVar17].numlayers,2);
  cio_write(poVar31,(long)poVar11[iVar17].mct,1);
  j2k_write_cox(j2k,0);
  iVar17 = cio_tell(poVar31);
  cio_seek(poVar31,iVar18);
  cio_write(poVar31,(long)(iVar17 - iVar18),2);
  cio_seek(poVar31,iVar17);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    j2k_add_mhmarker(j2k->cstr_info,0xff52,iVar18,iVar17 - iVar18);
  }
  poVar31 = j2k->cio;
  cio_write(poVar31,0xff5c,2);
  iVar17 = cio_tell(poVar31);
  cio_skip(poVar31,2);
  j2k_write_qcx(j2k,0);
  uVar19 = cio_tell(poVar31);
  cio_seek(poVar31,iVar17);
  cio_write(poVar31,(long)(int)(uVar19 - iVar17),2);
  uVar28 = (ulong)uVar19;
  cio_seek(poVar31,uVar19);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    uVar28 = 0xff5c;
    j2k_add_mhmarker(j2k->cstr_info,0xff5c,iVar17,uVar19 - iVar17);
  }
  uVar19 = image->numcomps;
  if (1 < uVar19 && cp->cinema != OFF) {
    compno = 1;
    do {
      j2k_write_coc(j2k,compno);
      uVar28 = (ulong)compno;
      j2k_write_qcc(j2k,compno);
      compno = compno + 1;
      uVar19 = image->numcomps;
    } while (compno < uVar19);
  }
  iVar17 = (int)uVar28;
  if (uVar19 != 0) {
    lVar32 = 0x328;
    v = 0;
    do {
      if (*(int *)((long)cp->tcps->tccps->stepsizes + lVar32 + -0x1c) != 0) {
        poVar11 = j2k->cp->tcps;
        poVar31 = j2k->cio;
        OVar10 = j2k->image->numcomps;
        cio_write(poVar31,0xff5e,2);
        bVar16 = (int)OVar10 < 0x101;
        cio_write(poVar31,6 - (ulong)bVar16,2);
        cio_write(poVar31,v,2 - (uint)bVar16);
        cio_write(poVar31,0,1);
        uVar28 = (ulong)*(int *)((long)poVar11->tccps->stepsizes + lVar32 + -0x1c);
        cio_write(poVar31,uVar28,1);
        uVar19 = image->numcomps;
      }
      iVar17 = (int)uVar28;
      v = v + 1;
      lVar32 = lVar32 + 0x438;
    } while (v < uVar19);
  }
  if ((cp->comment != (char *)0x0) && (__s = j2k->cp->comment, __s != (char *)0x0)) {
    poVar31 = j2k->cio;
    cio_write(poVar31,0xff64,2);
    iVar18 = cio_tell(poVar31);
    cio_skip(poVar31,2);
    cio_write(poVar31,1,2);
    if (*__s != '\0') {
      uVar19 = 1;
      uVar28 = 0;
      do {
        cio_write(poVar31,(long)__s[uVar28],1);
        uVar28 = (ulong)uVar19;
        sVar26 = strlen(__s);
        uVar19 = uVar19 + 1;
      } while (uVar28 < sVar26);
    }
    iVar17 = cio_tell(poVar31);
    iVar30 = iVar17 - iVar18;
    cio_seek(poVar31,iVar18);
    cio_write(poVar31,(long)iVar30,2);
    cio_seek(poVar31,iVar17);
    if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
      iVar17 = 0xff64;
      j2k_add_mhmarker(j2k->cstr_info,0xff64,iVar18,iVar30);
    }
  }
  iVar17 = j2k_calculate_tp(cp,iVar17,image,j2k);
  j2k->totnum_tp = iVar17;
  if (cp->cinema != OFF) {
    poVar31 = j2k->cio;
    iVar17 = cio_tell(poVar31);
    j2k->tlm_start = iVar17;
    cio_write(poVar31,0xff55,2);
    cio_write(poVar31,(long)j2k->totnum_tp * 5 + 4,2);
    cio_write(poVar31,0,1);
    cio_write(poVar31,0x50,1);
    cio_skip(poVar31,j2k->totnum_tp * 5);
    if (cp->cinema == CINEMA4K_24) {
      j2k_write_poc(j2k);
    }
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar17 = cio_tell(cio);
    cstr_info->main_head_end = iVar17 + -1;
  }
  tcd = tcd_create(j2k->cinfo);
  if (0 < cp->th * cp->tw) {
    lVar32 = 0;
    do {
      poVar11 = cp->tcps;
      lVar1 = lVar32 + 1;
      opj_event_msg(j2k->cinfo,4,"tile number %d / %d\n");
      iVar17 = (int)lVar32;
      j2k->curtileno = iVar17;
      j2k->cur_tp_num = 0;
      tcd->cur_totnum_tp = j2k->cur_totnum_tp[lVar32];
      if (lVar32 == 0) {
        tcd_malloc_encode(tcd,image,cp,0);
      }
      else {
        tcd_init_encode(tcd,image,cp,iVar17);
      }
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        iVar30 = cio_tell(cio);
        poVar23 = cstr_info->tile;
        iVar18 = j2k->curtileno;
        poVar23[iVar18].start_pos = iVar30 + j2k->pos_correction;
        poVar23[iVar18].maxmarknum = 10;
        poVar25 = (opj_marker_info_t *)malloc(0xf0);
        poVar23[iVar18].marker = poVar25;
        poVar23[iVar18].marknum = 0;
      }
      if (-1 < poVar11[lVar32].numpocs) {
        iVar18 = 0;
        iVar30 = 0;
        do {
          tcd->cur_pino = iVar30;
          iVar20 = j2k_get_num_tp(cp,iVar30,iVar17);
          tcd->tp_pos = cp->tp_pos;
          if (0 < iVar20) {
            iVar29 = 0;
            do {
              j2k->tp_num = iVar29;
              if (cstr_info != (opj_codestream_info_t *)0x0) {
                iVar21 = cio_tell(cio);
                cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
                     iVar21 + j2k->pos_correction;
              }
              poVar31 = j2k->cio;
              iVar21 = cio_tell(poVar31);
              j2k->sot_start = iVar21;
              cio_write(poVar31,0xff90,2);
              iVar21 = cio_tell(poVar31);
              cio_skip(poVar31,2);
              cio_write(poVar31,(long)j2k->curtileno,2);
              cio_skip(poVar31,4);
              cio_write(poVar31,(long)j2k->cur_tp_num,1);
              cio_write(poVar31,(long)j2k->cur_totnum_tp[j2k->curtileno],1);
              iVar22 = cio_tell(poVar31);
              cio_seek(poVar31,iVar21);
              cio_write(poVar31,(long)(iVar22 - iVar21),2);
              cio_seek(poVar31,iVar22);
              if (j2k->cstr_info == (opj_codestream_info_t *)0x0) {
LAB_001268a3:
                if ((j2k->cur_tp_num == 0) && (cp->cinema == OFF)) {
                  if (1 < image->numcomps) {
                    uVar19 = 1;
                    do {
                      j2k_write_coc(j2k,uVar19);
                      j2k_write_qcc(j2k,uVar19);
                      uVar19 = uVar19 + 1;
                    } while (uVar19 < image->numcomps);
                  }
                  if (cp->tcps[lVar32].numpocs != 0) {
                    j2k_write_poc(j2k);
                  }
                }
              }
              else if (j2k->cur_tp_num == 0) {
                j2k_add_tlmarker(j2k->curtileno,j2k->cstr_info,0xff90,iVar21,iVar22 - iVar21);
                goto LAB_001268a3;
              }
              if (cstr_info == (opj_codestream_info_t *)0x0) {
                j2k_write_sod(j2k,tcd);
                iVar21 = j2k->cur_tp_num;
              }
              else {
                iVar21 = cio_tell(cio);
                cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
                     iVar21 + j2k->pos_correction + 1;
                j2k_write_sod(j2k,tcd);
                iVar22 = cio_tell(cio);
                poVar15 = cstr_info->tile[j2k->curtileno].tp;
                iVar21 = j2k->cur_tp_num;
                poVar15[iVar21].tp_end_pos = j2k->pos_correction + iVar22 + -1;
                poVar15[iVar21].tp_start_pack = iVar18;
                iVar22 = cstr_info->packno;
                poVar15[iVar21].tp_numpacks = iVar22 - iVar18;
                iVar18 = iVar22;
              }
              j2k->cur_tp_num = iVar21 + 1;
              iVar29 = iVar29 + 1;
            } while (iVar29 != iVar20);
          }
          bVar16 = iVar30 < poVar11[lVar32].numpocs;
          iVar30 = iVar30 + 1;
        } while (bVar16);
      }
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        iVar17 = cio_tell(cio);
        cstr_info->tile[j2k->curtileno].end_pos = iVar17 + j2k->pos_correction + -1;
      }
      lVar32 = lVar1;
    } while (lVar1 < (long)cp->th * (long)cp->tw);
  }
  tcd_free_encode(tcd);
  tcd_destroy(tcd);
  free(j2k->cur_totnum_tp);
  cio_write(j2k->cio,0xffd9,2);
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar17 = cio_tell(cio);
    cstr_info->codestream_size = (iVar17 + j2k->pos_correction) - cstr_info->main_head_start;
  }
  return 1;
}

Assistant:

opj_bool j2k_encode(opj_j2k_t *j2k, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	int tileno, compno;
	opj_cp_t *cp = NULL;

	opj_tcd_t *tcd = NULL;	/* TCD component */

	j2k->cio = cio;	
	j2k->image = image;

	cp = j2k->cp;

	/* INDEX >> */
	j2k->cstr_info = cstr_info;
	if (cstr_info) {
		int compno;
		cstr_info->tile = (opj_tile_info_t *) opj_malloc(cp->tw * cp->th * sizeof(opj_tile_info_t));
		cstr_info->image_w = image->x1 - image->x0;
		cstr_info->image_h = image->y1 - image->y0;
		cstr_info->prog = (&cp->tcps[0])->prg;
		cstr_info->tw = cp->tw;
		cstr_info->th = cp->th;
		cstr_info->tile_x = cp->tdx;	/* new version parser */
		cstr_info->tile_y = cp->tdy;	/* new version parser */
		cstr_info->tile_Ox = cp->tx0;	/* new version parser */
		cstr_info->tile_Oy = cp->ty0;	/* new version parser */
		cstr_info->numcomps = image->numcomps;
		cstr_info->numlayers = (&cp->tcps[0])->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (compno=0; compno < image->numcomps; compno++) {
			cstr_info->numdecompos[compno] = (&cp->tcps[0])->tccps->numresolutions - 1;
		}
		cstr_info->D_max = 0.0;		/* ADD Marcela */
		cstr_info->main_head_start = cio_tell(cio); /* position of SOC */
		cstr_info->maxmarknum = 100;
		cstr_info->marker = (opj_marker_info_t *) opj_malloc(cstr_info->maxmarknum * sizeof(opj_marker_info_t));
		cstr_info->marknum = 0;
	}
	/* << INDEX */

	j2k_write_soc(j2k);
	j2k_write_siz(j2k);
	j2k_write_cod(j2k);
	j2k_write_qcd(j2k);

	if(cp->cinema){
		for (compno = 1; compno < image->numcomps; compno++) {
			j2k_write_coc(j2k, compno);
			j2k_write_qcc(j2k, compno);
		}
	}

	for (compno = 0; compno < image->numcomps; compno++) {
		opj_tcp_t *tcp = &cp->tcps[0];
		if (tcp->tccps[compno].roishift)
			j2k_write_rgn(j2k, compno, 0);
	}
	if (cp->comment != NULL) {
		j2k_write_com(j2k);
	}

	j2k->totnum_tp = j2k_calculate_tp(cp,image->numcomps,image,j2k);
	/* TLM Marker*/
	if(cp->cinema){
		j2k_write_tlm(j2k);
		if (cp->cinema == CINEMA4K_24) {
			j2k_write_poc(j2k);
		}
	}

	/* uncomment only for testing JPSEC marker writing */
	/* j2k_write_sec(j2k); */

	/* INDEX >> */
	if(cstr_info) {
		cstr_info->main_head_end = cio_tell(cio) - 1;
	}
	/* << INDEX */
	/**** Main Header ENDS here ***/

	/* create the tile encoder */
	tcd = tcd_create(j2k->cinfo);

	/* encode each tile */
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int pino;
		int tilepartno=0;
		/* UniPG>> */
		int acc_pack_num = 0;
		/* <<UniPG */


		opj_tcp_t *tcp = &cp->tcps[tileno];
		opj_event_msg(j2k->cinfo, EVT_INFO, "tile number %d / %d\n", tileno + 1, cp->tw * cp->th);

		j2k->curtileno = tileno;
		j2k->cur_tp_num = 0;
		tcd->cur_totnum_tp = j2k->cur_totnum_tp[j2k->curtileno];
		/* initialisation before tile encoding  */
		if (tileno == 0) {
			tcd_malloc_encode(tcd, image, cp, j2k->curtileno);
		} else {
			tcd_init_encode(tcd, image, cp, j2k->curtileno);
		}

		/* INDEX >> */
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].start_pos = cio_tell(cio) + j2k->pos_correction;
			cstr_info->tile[j2k->curtileno].maxmarknum = 10;
			cstr_info->tile[j2k->curtileno].marker = (opj_marker_info_t *) opj_malloc(cstr_info->tile[j2k->curtileno].maxmarknum * sizeof(opj_marker_info_t));
			cstr_info->tile[j2k->curtileno].marknum = 0;
		}
		/* << INDEX */

		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tot_num_tp;
			tcd->cur_pino=pino;

			/*Get number of tile parts*/
			tot_num_tp = j2k_get_num_tp(cp,pino,tileno);
			tcd->tp_pos = cp->tp_pos;

			for(tilepartno = 0; tilepartno < tot_num_tp ; tilepartno++){
				j2k->tp_num = tilepartno;
				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
					cio_tell(cio) + j2k->pos_correction;
				/* << INDEX */
				j2k_write_sot(j2k);

				if(j2k->cur_tp_num == 0 && cp->cinema == 0){
					for (compno = 1; compno < image->numcomps; compno++) {
						j2k_write_coc(j2k, compno);
						j2k_write_qcc(j2k, compno);
					}
					if (cp->tcps[tileno].numpocs) {
						j2k_write_poc(j2k);
					}
				}

				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
					cio_tell(cio) + j2k->pos_correction + 1;
				/* << INDEX */

				j2k_write_sod(j2k, tcd);

				/* INDEX >> */
				if(cstr_info) {
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_pos =
						cio_tell(cio) + j2k->pos_correction - 1;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pack =
						acc_pack_num;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_numpacks =
						cstr_info->packno - acc_pack_num;
					acc_pack_num = cstr_info->packno;
				}
				/* << INDEX */

				j2k->cur_tp_num++;
			}			
		}
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].end_pos = cio_tell(cio) + j2k->pos_correction - 1;
		}


		/*
		if (tile->PPT) { // BAD PPT !!! 
		FILE *PPT_file;
		int i;
		PPT_file=fopen("PPT","rb");
		fprintf(stderr,"%c%c%c%c",255,97,tile->len_ppt/256,tile->len_ppt%256);
		for (i=0;i<tile->len_ppt;i++) {
		unsigned char elmt;
		fread(&elmt, 1, 1, PPT_file);
		fwrite(&elmt,1,1,f);
		}
		fclose(PPT_file);
		unlink("PPT");
		}
		*/

	}

	/* destroy the tile encoder */
	tcd_free_encode(tcd);
	tcd_destroy(tcd);

	opj_free(j2k->cur_totnum_tp);

	j2k_write_eoc(j2k);

	if(cstr_info) {
		cstr_info->codestream_size = cio_tell(cio) + j2k->pos_correction;
		/* UniPG>> */
		/* The following adjustment is done to adjust the codestream size */
		/* if SOD is not at 0 in the buffer. Useful in case of JP2, where */
		/* the first bunch of bytes is not in the codestream              */
		cstr_info->codestream_size -= cstr_info->main_head_start;
		/* <<UniPG */
	}

#ifdef USE_JPWL
	/*
	preparation of JPWL marker segments
	*/
	if(cp->epc_on) {

		/* encode according to JPWL */
		jpwl_encode(j2k, cio, image);

	}
#endif /* USE_JPWL */

	return OPJ_TRUE;
}